

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

int nite::randomInt(int min,int max)

{
  uint uVar1;
  result_type_conflict1 rVar2;
  int iVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  undefined1 local_13a8 [8];
  mt19937 rng;
  uniform_int_distribution<int> uni;
  
  if (randomInt(int,int)::rd == '\0') {
    iVar3 = __cxa_guard_acquire(&randomInt(int,int)::rd);
    if (iVar3 != 0) {
      std::random_device::random_device(&randomInt::rd);
      __cxa_atexit(std::random_device::~random_device,&randomInt::rd,&__dso_handle);
      __cxa_guard_release(&randomInt(int,int)::rd);
    }
  }
  uVar1 = std::random_device::_M_getval();
  local_13a8 = (undefined1  [8])(ulong)uVar1;
  lVar5 = 1;
  uVar4 = (ulong)local_13a8;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
    rng._M_x[lVar5 + -1] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  rng._M_x[0x26f] = 0x270;
  rng._M_p._0_4_ = min;
  rng._M_p._4_4_ = max;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&rng._M_p,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_13a8,(param_type *)&rng._M_p);
  return rVar2;
}

Assistant:

int nite::randomInt(int min, int max){
	static std::random_device rd;
	std::mt19937 rng(rd());
	std::uniform_int_distribution<int> uni(min,max);
	return uni(rng);
}